

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItem::setPos(QGraphicsItem *this,QPointF *pos)

{
  bool bVar1;
  uint uVar2;
  Int IVar3;
  QGraphicsItemPrivate *pQVar4;
  undefined8 in_RSI;
  QGraphicsWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QPointF newPos;
  QVariant newPosVariant;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  QGraphicsWidgetPrivate *this_00;
  undefined8 local_80;
  undefined8 local_78;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_6c;
  undefined1 local_68 [16];
  undefined8 in_stack_ffffffffffffffa8;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             &(in_RDI->super_QGraphicsItemPrivate).extras);
  bVar1 = ::operator==((QPointF *)in_RDI,
                       (QPointF *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if ((!bVar1) &&
     (pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&(in_RDI->super_QGraphicsItemPrivate).extras),
     (*(ulong *)&pQVar4->field_0x160 >> 0x37 & 1) == 0)) {
    pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&(in_RDI->super_QGraphicsItemPrivate).extras);
    uVar2 = (uint)((ulong)*(undefined8 *)&pQVar4->field_0x160 >> 0x20) & 0xfffff;
    local_6c.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
         (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
         ::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_6c);
    if ((uVar2 & IVar3) == 0) {
      pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&(in_RDI->super_QGraphicsItemPrivate).extras);
      (*pQVar4->_vptr_QGraphicsItemPrivate[3])(pQVar4,in_RSI);
      pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&(in_RDI->super_QGraphicsItemPrivate).extras);
      if ((*(ulong *)&pQVar4->field_0x160 >> 0x18 & 1) != 0) {
        QGraphicsWidget::d_func((QGraphicsWidget *)0x97d831);
        QGraphicsWidgetPrivate::setGeometryFromSetPos(this_00);
      }
      pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&(in_RDI->super_QGraphicsItemPrivate).extras);
      if ((*(uint *)&pQVar4->field_0x168 >> 7 & 1) != 0) {
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                    *)&(in_RDI->super_QGraphicsItemPrivate).extras);
        QGraphicsItemPrivate::sendScenePosChange((QGraphicsItemPrivate *)in_stack_ffffffffffffffa8);
      }
    }
    else {
      local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::fromValue<QPointF>
                ((QPointF *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      (*(in_RDI->super_QGraphicsItemPrivate)._vptr_QGraphicsItemPrivate[0x21])
                (&local_28,in_RDI,0,&local_48);
      ::QVariant::~QVariant(&local_48);
      local_80 = 0xffffffffffffffff;
      local_78 = 0xffffffffffffffff;
      local_80 = ::QVariant::toPointF();
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)&(in_RDI->super_QGraphicsItemPrivate).extras);
      bVar1 = ::operator==((QPointF *)in_RDI,(QPointF *)CONCAT44(uVar2,in_stack_ffffffffffffff58));
      if (!bVar1) {
        pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)&(in_RDI->super_QGraphicsItemPrivate).extras);
        (*pQVar4->_vptr_QGraphicsItemPrivate[3])(pQVar4,&local_80);
        (*(in_RDI->super_QGraphicsItemPrivate)._vptr_QGraphicsItemPrivate[0x21])
                  (local_68,in_RDI,9,&local_28);
        ::QVariant::~QVariant((QVariant *)local_68);
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                    *)&(in_RDI->super_QGraphicsItemPrivate).extras);
        QGraphicsItemPrivate::sendScenePosChange((QGraphicsItemPrivate *)in_stack_ffffffffffffffa8);
      }
      ::QVariant::~QVariant((QVariant *)&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::setPos(const QPointF &pos)
{
    if (d_ptr->pos == pos)
        return;

    if (d_ptr->inDestructor)
        return;

    // Update and repositition.
    if (!(d_ptr->flags & (ItemSendsGeometryChanges | ItemSendsScenePositionChanges))) {
        d_ptr->setPosHelper(pos);
        if (d_ptr->isWidget)
            static_cast<QGraphicsWidget *>(this)->d_func()->setGeometryFromSetPos();
        if (d_ptr->scenePosDescendants)
            d_ptr->sendScenePosChange();
        return;
    }

    // Notify the item that the position is changing.
    const QVariant newPosVariant(itemChange(ItemPositionChange, QVariant::fromValue<QPointF>(pos)));
    QPointF newPos = newPosVariant.toPointF();
    if (newPos == d_ptr->pos)
        return;

    // Update and repositition.
    d_ptr->setPosHelper(newPos);

    // Send post-notification.
    itemChange(QGraphicsItem::ItemPositionHasChanged, newPosVariant);
    d_ptr->sendScenePosChange();
}